

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::MemberSyntax::isKind(SyntaxKind kind)

{
  if ((((((0x38 < kind - CheckerInstantiation) ||
         ((0x112ee4ac20902afU >> ((ulong)(kind - CheckerInstantiation) & 0x3f) & 1) == 0)) &&
        ((0x38 < kind - ExternInterfaceMethod ||
         ((0x1010208a11c6017U >> ((ulong)(kind - ExternInterfaceMethod) & 0x3f) & 1) == 0)))) &&
       ((0x39 < kind - LetDeclaration ||
        ((0x2c001a30008008bU >> ((ulong)(kind - LetDeclaration) & 0x3f) & 1) == 0)))) &&
      ((0x2d < kind - PackageDeclaration ||
       ((0x20a081100117U >> ((ulong)(kind - PackageDeclaration) & 0x3f) & 1) == 0)))) &&
     ((((0x3d < kind - AlwaysBlock ||
        ((0x301012000000008fU >> ((ulong)(kind - AlwaysBlock) & 0x3f) & 1) == 0)) &&
       ((0x3d < kind - SequenceDeclaration ||
        ((0x2800824000060001U >> ((ulong)(kind - SequenceDeclaration) & 0x3f) & 1) == 0)))) &&
      (((0x3b < kind - DefaultSkewItem ||
        ((0x800008020000001U >> ((ulong)(kind - DefaultSkewItem) & 0x3f) & 1) == 0)) &&
       (kind != UserDefinedNetDeclaration)))))) {
    return false;
  }
  return true;
}

Assistant:

bool MemberSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AlwaysBlock:
        case SyntaxKind::AlwaysCombBlock:
        case SyntaxKind::AlwaysFFBlock:
        case SyntaxKind::AlwaysLatchBlock:
        case SyntaxKind::AnonymousProgram:
        case SyntaxKind::BindDirective:
        case SyntaxKind::BinsSelection:
        case SyntaxKind::CaseGenerate:
        case SyntaxKind::CheckerDataDeclaration:
        case SyntaxKind::CheckerDeclaration:
        case SyntaxKind::CheckerInstantiation:
        case SyntaxKind::ClassDeclaration:
        case SyntaxKind::ClassMethodDeclaration:
        case SyntaxKind::ClassMethodPrototype:
        case SyntaxKind::ClassPropertyDeclaration:
        case SyntaxKind::ClockingDeclaration:
        case SyntaxKind::ClockingItem:
        case SyntaxKind::ConcurrentAssertionMember:
        case SyntaxKind::ConditionalPathDeclaration:
        case SyntaxKind::ConfigDeclaration:
        case SyntaxKind::ConstraintDeclaration:
        case SyntaxKind::ConstraintPrototype:
        case SyntaxKind::ContinuousAssign:
        case SyntaxKind::CoverCross:
        case SyntaxKind::CoverageBins:
        case SyntaxKind::CoverageOption:
        case SyntaxKind::CovergroupDeclaration:
        case SyntaxKind::Coverpoint:
        case SyntaxKind::DPIExport:
        case SyntaxKind::DPIImport:
        case SyntaxKind::DataDeclaration:
        case SyntaxKind::DefParam:
        case SyntaxKind::DefaultClockingReference:
        case SyntaxKind::DefaultDisableDeclaration:
        case SyntaxKind::DefaultSkewItem:
        case SyntaxKind::ElabSystemTask:
        case SyntaxKind::EmptyMember:
        case SyntaxKind::ExplicitAnsiPort:
        case SyntaxKind::ExternInterfaceMethod:
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::ExternUdpDecl:
        case SyntaxKind::FinalBlock:
        case SyntaxKind::ForwardTypedefDeclaration:
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::GenerateBlock:
        case SyntaxKind::GenerateRegion:
        case SyntaxKind::GenvarDeclaration:
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::IfGenerate:
        case SyntaxKind::IfNonePathDeclaration:
        case SyntaxKind::ImmediateAssertionMember:
        case SyntaxKind::ImplicitAnsiPort:
        case SyntaxKind::InitialBlock:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::LetDeclaration:
        case SyntaxKind::LibraryDeclaration:
        case SyntaxKind::LibraryIncludeStatement:
        case SyntaxKind::LocalVariableDeclaration:
        case SyntaxKind::LoopGenerate:
        case SyntaxKind::ModportClockingPort:
        case SyntaxKind::ModportDeclaration:
        case SyntaxKind::ModportSimplePortList:
        case SyntaxKind::ModportSubroutinePortList:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::NetAlias:
        case SyntaxKind::NetDeclaration:
        case SyntaxKind::NetTypeDeclaration:
        case SyntaxKind::PackageDeclaration:
        case SyntaxKind::PackageExportAllDeclaration:
        case SyntaxKind::PackageExportDeclaration:
        case SyntaxKind::PackageImportDeclaration:
        case SyntaxKind::ParameterDeclarationStatement:
        case SyntaxKind::PathDeclaration:
        case SyntaxKind::PortDeclaration:
        case SyntaxKind::PrimitiveInstantiation:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::PropertyDeclaration:
        case SyntaxKind::PulseStyleDeclaration:
        case SyntaxKind::SequenceDeclaration:
        case SyntaxKind::SpecifyBlock:
        case SyntaxKind::SpecparamDeclaration:
        case SyntaxKind::SystemTimingCheck:
        case SyntaxKind::TaskDeclaration:
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::TypedefDeclaration:
        case SyntaxKind::UdpDeclaration:
        case SyntaxKind::UserDefinedNetDeclaration:
            return true;
        default:
            return false;
    }
}